

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::str_format_internal::LengthModToString_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,LengthMod v)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "h";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "hh";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "l";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "ll";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "L";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "j";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "z";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "t";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "q";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string LengthModToString(LengthMod v) {
  switch (v) {
    case LengthMod::h:
      return "h";
    case LengthMod::hh:
      return "hh";
    case LengthMod::l:
      return "l";
    case LengthMod::ll:
      return "ll";
    case LengthMod::L:
      return "L";
    case LengthMod::j:
      return "j";
    case LengthMod::z:
      return "z";
    case LengthMod::t:
      return "t";
    case LengthMod::q:
      return "q";
    case LengthMod::none:
      return "";
  }
  return "";
}